

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cc
# Opt level: O0

string * ipx::StatusString_abi_cxx11_(Int status)

{
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  pointer ppVar2;
  iterator in_RDI;
  const_iterator entry;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  status_name;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffc78;
  char (*in_stack_fffffffffffffca0) [15];
  int *in_stack_fffffffffffffca8;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffcb0;
  allocator_type *in_stack_fffffffffffffcc0;
  undefined8 **ppuVar3;
  less<int> *in_stack_fffffffffffffcc8;
  undefined8 **ppuVar4;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  iterator ppVar5;
  allocator local_315;
  undefined4 local_314;
  _Self local_310;
  _Self local_308;
  undefined1 local_2fe [50];
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2b4;
  undefined8 *local_2b0;
  undefined1 *local_2a8 [5];
  undefined1 local_280 [40];
  undefined1 local_258 [40];
  undefined1 local_230 [40];
  undefined1 local_208 [40];
  undefined1 local_1e0 [40];
  undefined1 local_1b8 [40];
  undefined1 local_190 [40];
  undefined1 local_168 [40];
  undefined1 local_140 [40];
  undefined1 local_118 [40];
  undefined1 local_f0 [40];
  undefined1 local_c8 [40];
  undefined1 local_a0 [40];
  undefined1 local_78 [40];
  undefined8 *local_50;
  undefined8 local_48;
  
  local_2b0 = local_2a8;
  local_2b4 = 0;
  ppVar5 = in_RDI;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[8],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [8])in_stack_fffffffffffffca0);
  local_2b0 = (undefined8 *)local_280;
  local_2c8 = 1000;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[7],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [7])in_stack_fffffffffffffca0);
  local_2b0 = (undefined8 *)local_258;
  local_2cc = 0x3ed;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[8],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [8])in_stack_fffffffffffffca0);
  local_2b0 = (undefined8 *)local_230;
  local_2fe._46_4_ = 0x3ee;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[9],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [9])in_stack_fffffffffffffca0);
  local_2b0 = (undefined8 *)local_208;
  local_2fe._42_4_ = 0x3eb;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[14],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [14])in_stack_fffffffffffffca0);
  local_2b0 = (undefined8 *)local_1e0;
  local_2fe._38_4_ = 0x3ec;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[15],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  local_2b0 = (undefined8 *)local_1b8;
  local_2fe._34_4_ = 1;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[8],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [8])in_stack_fffffffffffffca0);
  local_2b0 = (undefined8 *)local_190;
  local_2fe._30_4_ = 2;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[10],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [10])in_stack_fffffffffffffca0);
  local_2b0 = (undefined8 *)local_168;
  local_2fe._26_4_ = 3;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[14],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [14])in_stack_fffffffffffffca0);
  local_2b0 = (undefined8 *)local_140;
  local_2fe._22_4_ = 4;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[12],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [12])in_stack_fffffffffffffca0);
  local_2b0 = (undefined8 *)local_118;
  local_2fe._18_4_ = 6;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[11],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [11])in_stack_fffffffffffffca0);
  local_2b0 = (undefined8 *)local_f0;
  local_2fe._14_4_ = 7;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[11],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [11])in_stack_fffffffffffffca0);
  local_2b0 = (undefined8 *)local_c8;
  local_2fe._10_4_ = 8;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[12],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [12])in_stack_fffffffffffffca0);
  local_2b0 = (undefined8 *)local_a0;
  local_2fe._6_4_ = 9;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[7],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [7])in_stack_fffffffffffffca0);
  local_2b0 = (undefined8 *)local_78;
  local_2fe._2_4_ = 10;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[6],_true>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (char (*) [6])in_stack_fffffffffffffca0);
  local_50 = local_2a8;
  local_48 = 0xf;
  this = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_2fe;
  std::
  allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator((allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x821950);
  __l._M_len = (size_type)ppVar5;
  __l._M_array = in_RDI;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(this,__l,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  std::
  allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x821989);
  ppuVar3 = (undefined8 **)local_2a8;
  ppuVar4 = &local_50;
  do {
    ppuVar4 = ppuVar4 + -5;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x8219b4);
  } while (ppuVar4 != ppuVar3);
  local_308._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffffc78,(key_type_conflict1 *)0x8219dd);
  local_310._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffc78);
  bVar1 = std::operator!=(&local_308,&local_310);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x821a2b);
    std::__cxx11::string::string((string *)in_RDI,(string *)&ppVar2->second);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"unknown",&local_315);
    std::allocator<char>::~allocator((allocator<char> *)&local_315);
  }
  local_314 = 1;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x821b8b);
  return (string *)ppVar5;
}

Assistant:

std::string StatusString(Int status) {
    const std::map<int,std::string> status_name = {
        {IPX_STATUS_not_run, "not run"},
        {IPX_STATUS_solved, "solved"},
        {IPX_STATUS_stopped, "stopped"},
        {IPX_STATUS_no_model, "no model"},
        {IPX_STATUS_out_of_memory, "out of memory"},
        {IPX_STATUS_internal_error, "internal error"},
        {IPX_STATUS_optimal, "optimal"},
        {IPX_STATUS_imprecise, "imprecise"},
        {IPX_STATUS_primal_infeas, "primal infeas"},
        {IPX_STATUS_dual_infeas, "dual infeas"},
        {IPX_STATUS_time_limit, "time limit"},
        {IPX_STATUS_iter_limit, "iter limit"},
        {IPX_STATUS_no_progress, "no progress"},
        {IPX_STATUS_failed, "failed"},
        {IPX_STATUS_debug, "debug"}
    };
    auto entry = status_name.find(status);
    if (entry != status_name.end())
        return entry->second;
    return "unknown";
}